

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode ossl_connect_common(Curl_cfilter *cf,Curl_easy *data,_Bool nonblocking,_Bool *done)

{
  void *pvVar1;
  ssl_connect_data *connssl;
  undefined8 *puVar2;
  curl_trc_feat *pcVar3;
  ssl_peer *psVar4;
  ossl_ctx *octx;
  uint uVar5;
  int iVar6;
  uint uVar7;
  CURLcode CVar8;
  uint err;
  uint uVar9;
  timediff_t tVar10;
  uint *puVar11;
  ssl_config_data *psVar12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  SSL_CIPHER *c;
  char *pcVar16;
  char *pcVar17;
  ulong error;
  int *piVar18;
  ulong *puVar19;
  BIO_METHOD *type;
  BIO *pBVar20;
  bool bVar21;
  char cVar22;
  bool bVar23;
  bool bVar24;
  int psigtype_nid;
  uchar *neg_protocol;
  uint local_19c;
  _Bool *local_198;
  ulong local_190;
  ulong local_188 [10];
  uchar *local_138;
  uchar auStack_130 [28];
  int iStack_114;
  
  pvVar1 = cf->ctx;
  uVar5 = Curl_conn_cf_get_socket(cf,data);
  *(undefined4 *)((long)pvVar1 + 0xb4) = 0;
  if (*(int *)((long)pvVar1 + 0xa8) == 3) {
    *done = true;
    return CURLE_OK;
  }
  CVar8 = CURLE_OK;
  local_198 = done;
  if (*(int *)((long)pvVar1 + 0xac) != 0) goto LAB_0017049f;
  cVar22 = '\x01';
  tVar10 = Curl_timeleft(data,(curltime *)0x0,true);
  if (tVar10 < 0) {
    Curl_failf(data,"SSL connection timeout");
  }
  else {
    psVar4 = (ssl_peer *)cf->ctx;
    octx = (ossl_ctx *)psVar4[1].dispname;
    auStack_130[8] = '\0';
    auStack_130[9] = '\0';
    auStack_130[10] = '\0';
    auStack_130[0xb] = '\0';
    auStack_130[0xc] = '\0';
    auStack_130[0xd] = '\0';
    auStack_130[0xe] = '\0';
    auStack_130[0xf] = '\0';
    auStack_130[0x10] = '\0';
    auStack_130[0x11] = '\0';
    auStack_130[0x12] = '\0';
    auStack_130[0x13] = '\0';
    auStack_130[0x14] = '\0';
    auStack_130[0x15] = '\0';
    auStack_130[0x16] = '\0';
    auStack_130[0x17] = '\0';
    local_138 = (uchar *)0x0;
    auStack_130[0] = '\0';
    auStack_130[1] = '\0';
    auStack_130[2] = '\0';
    auStack_130[3] = '\0';
    auStack_130[4] = '\0';
    auStack_130[5] = '\0';
    auStack_130[6] = '\0';
    auStack_130[7] = '\0';
    auStack_130[0x18] = '\0';
    auStack_130._25_3_ = 0;
    iStack_114 = 0;
    if (((alpn_spec *)psVar4[1].hostname == (alpn_spec *)0x0) ||
       (CVar8 = Curl_alpn_to_proto_buf((alpn_proto_buf *)&local_138,(alpn_spec *)psVar4[1].hostname)
       , CVar8 == CURLE_OK)) {
      CVar8 = Curl_ossl_ctx_init(octx,cf,data,psVar4,3,(uchar *)&local_138,(long)iStack_114,
                                 (Curl_ossl_ctx_setup_cb *)0x0,(void *)0x0,ossl_new_session_cb,cf);
      if (CVar8 == CURLE_OK) {
        type = (BIO_METHOD *)BIO_meth_new(0x401);
        if (type == (BIO_METHOD *)0x0) {
          octx->bio_method = (BIO_METHOD *)0x0;
        }
        else {
          BIO_meth_set_write(type,ossl_bio_cf_out_write);
          BIO_meth_set_read(type,ossl_bio_cf_in_read);
          BIO_meth_set_ctrl(type,ossl_bio_cf_ctrl);
          BIO_meth_set_create(type,ossl_bio_cf_create);
          BIO_meth_set_destroy(type);
          octx->bio_method = (BIO_METHOD *)type;
          pBVar20 = BIO_new(type);
          if (pBVar20 != (BIO *)0x0) {
            BIO_set_data(pBVar20,cf);
            BIO_up_ref(pBVar20);
            SSL_set0_rbio(octx->ssl,pBVar20);
            SSL_set0_wbio(octx->ssl,pBVar20);
            if (((((alpn_spec *)psVar4[1].hostname != (alpn_spec *)0x0) &&
                 (Curl_alpn_to_proto_str
                            ((alpn_proto_buf *)&local_138,(alpn_spec *)psVar4[1].hostname),
                 data != (Curl_easy *)0x0)) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                (0 < pcVar3->log_level)))) {
              Curl_infof(data,"ALPN: curl offers %s",&local_138);
            }
            *(undefined4 *)((long)&psVar4[4].dispname + 4) = 1;
            CVar8 = CURLE_OK;
            goto LAB_00170e01;
          }
        }
        CVar8 = CURLE_OUT_OF_MEMORY;
      }
    }
    else {
      Curl_failf(data,"Error determining ALPN");
      CVar8 = CURLE_SSL_CONNECT_ERROR;
    }
LAB_00170e01:
    cVar22 = (CVar8 != CURLE_OK) * '\x02';
  }
  if (cVar22 == '\x02') {
    return CVar8;
  }
  if (cVar22 != '\0') {
    return CURLE_OPERATION_TIMEDOUT;
  }
LAB_0017049f:
  do {
    if (*(int *)((long)pvVar1 + 0xac) != 1) {
      if (*(int *)((long)pvVar1 + 0xac) == 2) {
        psVar4 = (ssl_peer *)cf->ctx;
        CVar8 = Curl_oss_check_peer_cert(cf,data,(ossl_ctx *)psVar4[1].dispname,psVar4);
        if (CVar8 != CURLE_OK) {
          return CVar8;
        }
        *(undefined4 *)((long)&psVar4[4].dispname + 4) = 3;
        CVar8 = CURLE_OK;
      }
      bVar24 = *(int *)((long)pvVar1 + 0xac) == 3;
      if (bVar24) {
        *(undefined4 *)((long)pvVar1 + 0xa8) = 3;
      }
      *local_198 = bVar24;
      *(undefined4 *)((long)pvVar1 + 0xac) = 0;
      return CVar8;
    }
    tVar10 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar10 < 0) {
      Curl_failf(data,"SSL connection timeout");
      CVar8 = CURLE_OPERATION_TIMEDOUT;
      bVar24 = true;
    }
    else {
      if ((!nonblocking) && (uVar7 = *(uint *)((long)pvVar1 + 0xb4), uVar7 != 0)) {
        iVar6 = Curl_socket_check(-(uint)((uVar7 & 1) == 0) | uVar5,-1,
                                  -(uint)((uVar7 & 2) == 0) | uVar5,tVar10);
        if (iVar6 < 0) {
          puVar11 = (uint *)__errno_location();
          Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar11);
          CVar8 = CURLE_SSL_CONNECT_ERROR;
LAB_00170574:
          bVar23 = false;
          bVar24 = true;
        }
        else {
          if (iVar6 == 0) {
            Curl_failf(data,"SSL connection timeout");
            CVar8 = CURLE_OPERATION_TIMEDOUT;
            goto LAB_00170574;
          }
          bVar24 = false;
          bVar23 = true;
        }
        if (!bVar23) goto LAB_00170b77;
      }
      connssl = (ssl_connect_data *)cf->ctx;
      puVar2 = (undefined8 *)connssl->backend;
      psVar12 = Curl_ssl_cf_get_config(cf,data);
      connssl->io_need = 0;
      ERR_clear_error();
      uVar7 = SSL_connect((SSL *)puVar2[1]);
      if ((*(byte *)((long)puVar2 + 0x25) & 1) == 0) {
        CVar8 = Curl_ssl_setup_x509_store(cf,data,(SSL_CTX *)*puVar2);
        if (CVar8 == CURLE_OK) {
          *(byte *)((long)puVar2 + 0x25) = *(byte *)((long)puVar2 + 0x25) | 1;
          goto LAB_001705e6;
        }
      }
      else {
LAB_001705e6:
        if (uVar7 == 1) {
          local_188[0] = local_188[0] & 0xffffffff00000000;
          connssl->connecting_state = ssl_connect_3;
          SSL_get_peer_signature_type_nid(puVar2[1],local_188);
          lVar13 = SSL_ctrl((SSL *)puVar2[1],0x86,0,(void *)0x0);
          pcVar14 = OBJ_nid2sn((uint)lVar13 & 0xffff);
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
              (0 < pcVar3->log_level)))) {
            pcVar15 = SSL_get_version((SSL *)puVar2[1]);
            c = SSL_get_current_cipher((SSL *)puVar2[1]);
            pcVar16 = SSL_CIPHER_get_name(c);
            if (pcVar14 == (char *)0x0) {
              pcVar14 = "[blank]";
            }
            pcVar17 = OBJ_nid2sn((int)local_188[0]);
            Curl_infof(data,"SSL connection using %s / %s / %s / %s",pcVar15,pcVar16,pcVar14,pcVar17
                      );
          }
          if (connssl->alpn != (alpn_spec *)0x0) {
            SSL_get0_alpn_selected(puVar2[1],&local_138,&local_19c);
            CVar8 = Curl_alpn_set_negotiated(cf,data,connssl,local_138,(ulong)local_19c);
            goto LAB_00170b44;
          }
        }
        else {
          err = SSL_get_error((SSL *)puVar2[1],uVar7);
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
            pcVar3 = (data->state).feat;
            if (pcVar3 == (curl_trc_feat *)0x0) {
              if (cf != (Curl_cfilter *)0x0) goto LAB_0017072f;
            }
            else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar3->log_level)) {
LAB_0017072f:
              if (0 < cf->cft->log_level) {
                Curl_trc_cf_infof(data,cf,"SSL_connect() -> err=%d, detail=%d",(ulong)uVar7,
                                  (ulong)err);
              }
            }
          }
          if ((int)err < 9) {
            if (err != 2) {
              if (err != 3) {
LAB_00170811:
                memset(&local_138,0,0x100);
                connssl->connecting_state = ssl_connect_2;
                error = ERR_get_error();
                uVar9 = (uint)error;
                bVar24 = (int)uVar9 < 0;
                uVar7 = 0x7fffffff;
                if (!bVar24) {
                  uVar7 = 0x7fffff;
                }
                uVar7 = uVar7 & uVar9;
                bVar23 = (uVar9 & 0xff800000) != 0xa000000;
                if ((bVar23 || bVar24) || ((uVar7 != 0x415 && (uVar7 != 0x86)))) {
                  ossl_strerror(error,(char *)&local_138,0x100);
                  bVar21 = (bVar23 || bVar24) || uVar7 != 0x45c;
                  CVar8 = CURLE_SSL_CONNECT_ERROR;
                  if ((!bVar23 && !bVar24) && uVar7 == 0x45c) {
                    CVar8 = CURLE_SSL_CLIENTCERT;
                  }
                }
                else {
                  local_190 = error;
                  lVar13 = SSL_get_verify_result((SSL *)puVar2[1]);
                  if (lVar13 == 0) {
                    Curl_failf(data,"%s","SSL certificate verification failed");
                    CVar8 = CURLE_PEER_FAILED_VERIFICATION;
                    goto LAB_00170b44;
                  }
                  psVar12->certverifyresult = lVar13;
                  X509_verify_cert_error_string(lVar13);
                  bVar21 = false;
                  curl_msnprintf((char *)&local_138,0x100,"SSL certificate problem: %s");
                  CVar8 = CURLE_PEER_FAILED_VERIFICATION;
                  error = local_190;
                }
                if ((error == 0) && (bVar21)) {
                  local_188[8] = 0;
                  local_188[9] = 0;
                  local_188[6] = 0;
                  local_188[7] = 0;
                  local_188[4] = 0;
                  local_188[5] = 0;
                  local_188[2] = 0;
                  local_188[3] = 0;
                  local_188[0] = 0;
                  local_188[1] = 0;
                  piVar18 = __errno_location();
                  if ((*piVar18 != 0) && (err == 5)) {
                    Curl_strerror(*piVar18,(char *)local_188,0x50);
                  }
                  puVar19 = local_188;
                  if ((char)local_188[0] == '\0') {
                    puVar19 = (ulong *)SSL_ERROR_to_str(err);
                  }
                  Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%d ",puVar19,
                             (connssl->peer).hostname,(ulong)(uint)(connssl->peer).port);
                  CVar8 = CURLE_SSL_CONNECT_ERROR;
                }
                else {
                  Curl_failf(data,"%s",&local_138);
                }
                goto LAB_00170b44;
              }
              if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
                pcVar3 = (data->state).feat;
                if (pcVar3 == (curl_trc_feat *)0x0) {
                  if (cf != (Curl_cfilter *)0x0) goto LAB_00170a6b;
                }
                else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar3->log_level)) {
LAB_00170a6b:
                  if (0 < cf->cft->log_level) {
                    Curl_trc_cf_infof(data,cf,"SSL_connect() -> want send");
                  }
                }
              }
              connssl->io_need = 2;
              goto LAB_00170b42;
            }
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
              pcVar3 = (data->state).feat;
              if (pcVar3 == (curl_trc_feat *)0x0) {
                if (cf != (Curl_cfilter *)0x0) goto LAB_00170ad2;
              }
              else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar3->log_level)) {
LAB_00170ad2:
                if (0 < cf->cft->log_level) {
                  Curl_trc_cf_infof(data,cf,"SSL_connect() -> want recv");
                }
              }
            }
            connssl->io_need = 1;
          }
          else {
            if (err == 9) {
              if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
                pcVar3 = (data->state).feat;
                if (pcVar3 == (curl_trc_feat *)0x0) {
                  if (cf != (Curl_cfilter *)0x0) goto LAB_00170b0b;
                }
                else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar3->log_level)) {
LAB_00170b0b:
                  if (0 < cf->cft->log_level) {
                    pcVar14 = "SSL_connect() -> want async";
LAB_00170b28:
                    Curl_trc_cf_infof(data,cf,pcVar14);
                  }
                }
              }
            }
            else {
              if (err != 0xc) goto LAB_00170811;
              if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
                pcVar3 = (data->state).feat;
                if (pcVar3 == (curl_trc_feat *)0x0) {
                  if (cf != (Curl_cfilter *)0x0) goto LAB_00170aab;
                }
                else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar3->log_level)) {
LAB_00170aab:
                  if (0 < cf->cft->log_level) {
                    pcVar14 = "SSL_connect() -> want retry_verify";
                    goto LAB_00170b28;
                  }
                }
              }
            }
            connssl->io_need = 1;
            connssl->connecting_state = ssl_connect_2;
          }
        }
LAB_00170b42:
        CVar8 = CURLE_OK;
      }
LAB_00170b44:
      bVar24 = true;
      if ((CVar8 == CURLE_OK) && ((!nonblocking || (*(int *)((long)pvVar1 + 0xac) != 1)))) {
        bVar24 = false;
        CVar8 = CURLE_OK;
      }
    }
LAB_00170b77:
    if (bVar24) {
      if (!bVar24) {
        CVar8 = CURLE_OPERATION_TIMEDOUT;
      }
      return CVar8;
    }
  } while( true );
}

Assistant:

static CURLcode ossl_connect_common(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result = CURLE_OK;
  struct ssl_connect_data *connssl = cf->ctx;
  curl_socket_t sockfd = Curl_conn_cf_get_socket(cf, data);
  int what;

  connssl->io_need = CURL_SSL_IO_NEED_NONE;
  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we are allowed */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time is already up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(cf, data);
    if(result)
      goto out;
  }

  while(ssl_connect_2 == connssl->connecting_state) {

    /* check allowed time left */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      result = CURLE_OPERATION_TIMEDOUT;
      goto out;
    }

    /* if ssl is expecting something, check if it is available. */
    if(!nonblocking && connssl->io_need) {
      curl_socket_t writefd = (connssl->io_need & CURL_SSL_IO_NEED_SEND) ?
        sockfd : CURL_SOCKET_BAD;
      curl_socket_t readfd = (connssl->io_need & CURL_SSL_IO_NEED_RECV) ?
        sockfd : CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        result = CURLE_SSL_CONNECT_ERROR;
        goto out;
      }
      if(0 == what) {
        /* timeout */
        failf(data, "SSL connection timeout");
        result = CURLE_OPERATION_TIMEDOUT;
        goto out;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(cf, data);
    if(result || (nonblocking && (ssl_connect_2 == connssl->connecting_state)))
      goto out;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

out:
  return result;
}